

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLUnknown::ShallowClone(XMLUnknown *this,XMLDocument *doc)

{
  char *str;
  XMLNode *pXVar1;
  XMLUnknown *text;
  XMLDocument *doc_local;
  XMLUnknown *this_local;
  
  text = (XMLUnknown *)doc;
  if (doc == (XMLDocument *)0x0) {
    text = (XMLUnknown *)(this->super_XMLNode)._document;
  }
  str = XMLNode::Value(&this->super_XMLNode);
  pXVar1 = &XMLDocument::NewUnknown((XMLDocument *)text,str)->super_XMLNode;
  return pXVar1;
}

Assistant:

XMLNode* XMLUnknown::ShallowClone( XMLDocument* doc ) const
{
    if ( !doc ) {
        doc = _document;
    }
    XMLUnknown* text = doc->NewUnknown( Value() );	// fixme: this will always allocate memory. Intern?
    return text;
}